

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floattype.cpp
# Opt level: O2

void __thiscall FloatType::FloatType(FloatType *this)

{
  long lVar1;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l_00;
  initializer_list<Function> __l_01;
  allocator local_f3a;
  allocator local_f39;
  allocator local_f38;
  allocator local_f37;
  allocator local_f36;
  char local_f35;
  OperatorChar local_f34;
  OperatorChar local_f30;
  OperatorChar local_f2c;
  OperatorChar local_f28;
  OperatorChar local_f24;
  OperatorChar local_f20;
  OperatorChar local_f1c [2];
  allocator_type local_f16;
  allocator local_f15;
  allocator local_f14;
  allocator local_f13;
  allocator local_f12;
  allocator local_f11;
  allocator local_f10;
  allocator local_f0f;
  allocator local_f0e;
  allocator local_f0d;
  allocator local_f0c;
  allocator local_f0b;
  allocator local_f0a;
  allocator local_f09;
  allocator local_f08;
  allocator local_f07;
  allocator local_f06;
  allocator local_f05;
  allocator local_f04;
  allocator local_f03;
  allocator local_f02;
  allocator local_f01;
  _Any_data local_f00;
  code *local_ef0;
  code *local_ee8;
  _Any_data local_ee0;
  code *local_ed0;
  code *local_ec8;
  _Any_data local_ec0;
  code *local_eb0;
  code *local_ea8;
  _Any_data local_ea0;
  code *local_e90;
  code *local_e88;
  _Any_data local_e80;
  code *local_e70;
  code *local_e68;
  _Any_data local_e60;
  code *local_e50;
  code *local_e48;
  _Any_data local_e40;
  code *local_e30;
  code *local_e28;
  _Any_data local_e20;
  code *local_e10;
  code *local_e08;
  _Any_data local_e00;
  code *local_df0;
  code *local_de8;
  _Any_data local_de0;
  code *local_dd0;
  code *local_dc8;
  _Any_data local_dc0;
  code *local_db0;
  code *local_da8;
  _Any_data local_da0;
  code *local_d90;
  code *local_d88;
  _Any_data local_d80;
  code *local_d70;
  code *local_d68;
  vector<Function,_std::allocator<Function>_> local_d60;
  string local_d48;
  string local_d28;
  string local_d08;
  string local_ce8;
  string local_cc8;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  string local_be8;
  string local_bc8;
  string local_ba8;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  undefined1 local_a08 [144];
  _Any_data local_978;
  code *local_968;
  code *local_960;
  _Any_data local_958;
  code *local_948;
  code *local_940;
  _Any_data local_938;
  code *local_928;
  code *local_920;
  _Any_data local_918;
  code *local_908;
  code *local_900;
  _Any_data local_8f8;
  code *local_8e8;
  code *local_8e0;
  _Any_data local_8d8;
  code *local_8c8;
  code *local_8c0;
  _Any_data local_8b8;
  code *local_8a8;
  code *local_8a0;
  Operator local_898;
  Operator local_848;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_7f8;
  EnvironmentScope local_7c0;
  Operator local_750;
  Operator local_700;
  undefined1 local_6b0 [88];
  undefined1 local_658 [88];
  undefined1 local_600 [88];
  pair<const_OperatorChar,_Operator> local_5a8;
  undefined1 local_550 [88];
  undefined1 local_4f8 [200];
  Function local_430;
  Function local_3b0;
  Function local_330;
  Function local_2b0;
  Function local_230;
  Function local_1b0;
  Function local_130;
  Function local_b0;
  
  (this->super_NumberType)._vptr_NumberType = (_func_int **)&PTR__FloatType_0014ea08;
  (this->mBinaryOperators)._M_h._M_buckets = &(this->mBinaryOperators)._M_h._M_single_bucket;
  (this->mBinaryOperators)._M_h._M_bucket_count = 1;
  (this->mBinaryOperators)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mBinaryOperators)._M_h._M_element_count = 0;
  (this->mBinaryOperators)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mBinaryOperators)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mBinaryOperators)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mUnaryOperators)._M_h._M_buckets = &(this->mUnaryOperators)._M_h._M_single_bucket;
  (this->mUnaryOperators)._M_h._M_bucket_count = 1;
  (this->mUnaryOperators)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mUnaryOperators)._M_h._M_element_count = 0;
  (this->mUnaryOperators)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mUnaryOperators)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mUnaryOperators)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  EnvironmentScope::EnvironmentScope(&this->mEnvironment);
  local_f35 = '^';
  OperatorChar::OperatorChar(local_f1c,'^');
  local_8b8._M_unused._M_object = (void *)0x0;
  local_8b8._8_8_ = 0;
  local_8a0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:5:65)>
              ::_M_invoke;
  local_8a8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:5:65)>
              ::_M_manager;
  Operator::binary((Operator *)local_a08,local_f1c[0],6,RIGHT,(BinaryOperatorFn *)&local_8b8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_6b0,&local_f35,(Operator *)local_a08);
  local_f36 = (allocator)0x2a;
  OperatorChar::OperatorChar(&local_f20,'*');
  local_8d8._M_unused._M_object = (void *)0x0;
  local_8d8._8_8_ = 0;
  local_8c0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:8:64)>
              ::_M_invoke;
  local_8c8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:8:64)>
              ::_M_manager;
  Operator::binary((Operator *)&local_7c0,local_f20,5,LEFT,(BinaryOperatorFn *)&local_8d8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_658,(char *)&local_f36,
             (Operator *)&local_7c0);
  local_f37 = (allocator)0x2f;
  OperatorChar::OperatorChar(&local_f24,'/');
  local_8f8._M_unused._M_object = (void *)0x0;
  local_8f8._8_8_ = 0;
  local_8e0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:11:64)>
              ::_M_invoke;
  local_8e8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:11:64)>
              ::_M_manager;
  Operator::binary(&local_848,local_f24,5,LEFT,(BinaryOperatorFn *)&local_8f8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_600,(char *)&local_f37,&local_848);
  local_f38 = (allocator)0x2b;
  OperatorChar::OperatorChar(&local_f28,'+');
  local_918._M_unused._M_object = (void *)0x0;
  local_918._8_8_ = 0;
  local_900 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:14:64)>
              ::_M_invoke;
  local_908 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:14:64)>
              ::_M_manager;
  Operator::binary(&local_898,local_f28,4,LEFT,(BinaryOperatorFn *)&local_918);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_5a8,(char *)&local_f38,&local_898);
  local_f39 = (allocator)0x2d;
  OperatorChar::OperatorChar(&local_f2c,'-');
  local_938._M_unused._M_object = (void *)0x0;
  local_938._8_8_ = 0;
  local_920 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:17:64)>
              ::_M_invoke;
  local_928 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:17:64)>
              ::_M_manager;
  Operator::binary(&local_700,local_f2c,4,LEFT,(BinaryOperatorFn *)&local_938);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_550,(char *)&local_f39,&local_700);
  local_f3a = (allocator)0x3d;
  OperatorChar::OperatorChar(&local_f30,'=');
  local_958._M_unused._M_object = (void *)0x0;
  local_958._8_8_ = 0;
  local_940 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:20:65)>
              ::_M_invoke;
  local_948 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:20:65)>
              ::_M_manager;
  Operator::binary(&local_750,local_f30,1,RIGHT,(BinaryOperatorFn *)&local_958);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_4f8,(char *)&local_f3a,&local_750);
  __l._M_len = 6;
  __l._M_array = (iterator)local_6b0;
  std::
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->mBinaryOperators)._M_h,__l);
  lVar1 = 0x1c0;
  do {
    Operator::~Operator((Operator *)(local_6b0 + lVar1));
    lVar1 = lVar1 + -0x58;
  } while (lVar1 != -0x50);
  Operator::~Operator(&local_750);
  std::_Function_base::~_Function_base((_Function_base *)&local_958);
  Operator::~Operator(&local_700);
  std::_Function_base::~_Function_base((_Function_base *)&local_938);
  Operator::~Operator(&local_898);
  std::_Function_base::~_Function_base((_Function_base *)&local_918);
  Operator::~Operator(&local_848);
  std::_Function_base::~_Function_base((_Function_base *)&local_8f8);
  Operator::~Operator((Operator *)&local_7c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_8d8);
  Operator::~Operator((Operator *)local_a08);
  std::_Function_base::~_Function_base((_Function_base *)&local_8b8);
  local_7c0.mVariables._M_h._M_buckets._0_1_ = 0x2d;
  OperatorChar::OperatorChar(&local_f34,'-');
  local_978._M_unused._M_object = (void *)0x0;
  local_978._8_8_ = 0;
  local_960 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:26:63)>
              ::_M_invoke;
  local_968 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:26:63)>
              ::_M_manager;
  Operator::unary((Operator *)local_a08,local_f34,7,LEFT,(UnaryOperatorFn *)&local_978);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_6b0,(char *)&local_7c0,
             (Operator *)local_a08);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_6b0;
  std::
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->mUnaryOperators)._M_h,__l_00);
  Operator::~Operator((Operator *)(local_6b0 + 8));
  Operator::~Operator((Operator *)local_a08);
  std::_Function_base::~_Function_base((_Function_base *)&local_978);
  ResultValue::ResultValue((ResultValue *)&local_848,3.141592653589793);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
  ::pair<const_char_(&)[3],_ResultValue,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
              *)local_a08,(char (*) [3])"pi",(ResultValue *)&local_848);
  ResultValue::ResultValue((ResultValue *)&local_898,2.718281828459045);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
  ::pair<const_char_(&)[2],_ResultValue,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
              *)(local_a08 + 0x48),(char (*) [2])0x13e191,(ResultValue *)&local_898);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ResultValue>,std::allocator<std::pair<std::__cxx11::string_const,ResultValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,ResultValue>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ResultValue>,std::allocator<std::pair<std::__cxx11::string_const,ResultValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_7f8,local_a08,&local_978,0,&local_700,&local_750,&local_f35);
  std::__cxx11::string::string((string *)&local_a28,"sin",&local_f36);
  local_d80._8_8_ = 0;
  local_d68 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:35:30)>
              ::_M_invoke;
  local_d70 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:35:30)>
              ::_M_manager;
  local_d80._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_a48,"Computes the sine of x.",&local_f37);
  Function::Function((Function *)local_6b0,&local_a28,1,(ExternalFunction *)&local_d80,&local_a48);
  std::__cxx11::string::string((string *)&local_a68,"cos",&local_f38);
  local_da0._8_8_ = 0;
  local_d88 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:38:30)>
              ::_M_invoke;
  local_d90 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:38:30)>
              ::_M_manager;
  local_da0._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_a88,"Computes the cosine of x.",&local_f39);
  Function::Function((Function *)(local_658 + 0x28),&local_a68,1,(ExternalFunction *)&local_da0,
                     &local_a88);
  std::__cxx11::string::string((string *)&local_aa8,"tan",&local_f3a);
  local_dc0._8_8_ = 0;
  local_da8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:41:30)>
              ::_M_invoke;
  local_db0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:41:30)>
              ::_M_manager;
  local_dc0._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_ac8,"Computes the tangent of x.",&local_f01);
  Function::Function((Function *)(local_600 + 0x50),&local_aa8,1,(ExternalFunction *)&local_dc0,
                     &local_ac8);
  std::__cxx11::string::string((string *)&local_ae8,"sqrt",&local_f02);
  local_de0._8_8_ = 0;
  local_dc8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:44:31)>
              ::_M_invoke;
  local_dd0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:44:31)>
              ::_M_manager;
  local_de0._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_b08,"Computes the square root of x.",&local_f03);
  Function::Function((Function *)(local_550 + 0x20),&local_ae8,1,(ExternalFunction *)&local_de0,
                     &local_b08);
  std::__cxx11::string::string((string *)&local_b28,"asin",&local_f04);
  local_e00._8_8_ = 0;
  local_de8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:47:31)>
              ::_M_invoke;
  local_df0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:47:31)>
              ::_M_manager;
  local_e00._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_b48,"Computes the inverse sine of x.",&local_f05);
  Function::Function((Function *)(local_4f8 + 0x48),&local_b28,1,(ExternalFunction *)&local_e00,
                     &local_b48);
  std::__cxx11::string::string((string *)&local_b68,"acos",&local_f06);
  local_e20._8_8_ = 0;
  local_e08 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:50:31)>
              ::_M_invoke;
  local_e10 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:50:31)>
              ::_M_manager;
  local_e20._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_b88,"Computes the inverse cosine of x.",&local_f07);
  Function::Function(&local_430,&local_b68,1,(ExternalFunction *)&local_e20,&local_b88);
  std::__cxx11::string::string((string *)&local_ba8,"atan",&local_f08);
  local_e40._8_8_ = 0;
  local_e28 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:53:31)>
              ::_M_invoke;
  local_e30 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:53:31)>
              ::_M_manager;
  local_e40._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_bc8,"Computes the inverse tangent of x.",&local_f09)
  ;
  Function::Function(&local_3b0,&local_ba8,1,(ExternalFunction *)&local_e40,&local_bc8);
  std::__cxx11::string::string((string *)&local_be8,"ln",&local_f0a);
  local_e60._8_8_ = 0;
  local_e48 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:56:29)>
              ::_M_invoke;
  local_e50 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:56:29)>
              ::_M_manager;
  local_e60._M_unused._M_object = this;
  std::__cxx11::string::string
            ((string *)&local_c08,"Computes the natural logarithm of x.",&local_f0b);
  Function::Function(&local_330,&local_be8,1,(ExternalFunction *)&local_e60,&local_c08);
  std::__cxx11::string::string((string *)&local_c28,"log",&local_f0c);
  local_e80._8_8_ = 0;
  local_e68 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:59:30)>
              ::_M_invoke;
  local_e70 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:59:30)>
              ::_M_manager;
  local_e80._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_c48,"Computes the 10-logarithm of x.",&local_f0d);
  Function::Function(&local_2b0,&local_c28,1,(ExternalFunction *)&local_e80,&local_c48);
  std::__cxx11::string::string((string *)&local_c68,"logb",&local_f0e);
  local_ea0._8_8_ = 0;
  local_e88 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:62:31)>
              ::_M_invoke;
  local_e90 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:62:31)>
              ::_M_manager;
  local_ea0._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_c88,"Computes the y-logarithm of x.",&local_f0f);
  Function::Function(&local_230,&local_c68,2,(ExternalFunction *)&local_ea0,&local_c88);
  std::__cxx11::string::string((string *)&local_ca8,"ceil",&local_f10);
  local_ec0._8_8_ = 0;
  local_ea8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:65:31)>
              ::_M_invoke;
  local_eb0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:65:31)>
              ::_M_manager;
  local_ec0._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_cc8,"Ceils x.",&local_f11);
  Function::Function(&local_1b0,&local_ca8,1,(ExternalFunction *)&local_ec0,&local_cc8);
  std::__cxx11::string::string((string *)&local_ce8,"floor",&local_f12);
  local_ee0._8_8_ = 0;
  local_ec8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:68:32)>
              ::_M_invoke;
  local_ed0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:68:32)>
              ::_M_manager;
  local_ee0._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_d08,"Floors x.",&local_f13);
  Function::Function(&local_130,&local_ce8,1,(ExternalFunction *)&local_ee0,&local_d08);
  std::__cxx11::string::string((string *)&local_d28,"round",&local_f14);
  local_f00._8_8_ = 0;
  local_ee8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:71:32)>
              ::_M_invoke;
  local_ef0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:71:32)>
              ::_M_manager;
  local_f00._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_d48,"Rounds x.",&local_f15);
  Function::Function(&local_b0,&local_d28,1,(ExternalFunction *)&local_f00,&local_d48);
  __l_01._M_len = 0xd;
  __l_01._M_array = (iterator)local_6b0;
  std::vector<Function,_std::allocator<Function>_>::vector(&local_d60,__l_01,&local_f16);
  EnvironmentScope::EnvironmentScope(&local_7c0,(Variables *)&local_7f8,&local_d60);
  EnvironmentScope::operator=(&this->mEnvironment,&local_7c0);
  EnvironmentScope::~EnvironmentScope(&local_7c0);
  std::vector<Function,_std::allocator<Function>_>::~vector(&local_d60);
  lVar1 = 0x600;
  do {
    Function::~Function((Function *)(local_6b0 + lVar1));
    lVar1 = lVar1 + -0x80;
  } while (lVar1 != -0x80);
  std::__cxx11::string::~string((string *)&local_d48);
  std::_Function_base::~_Function_base((_Function_base *)&local_f00);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_d08);
  std::_Function_base::~_Function_base((_Function_base *)&local_ee0);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::_Function_base::~_Function_base((_Function_base *)&local_ec0);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_c88);
  std::_Function_base::~_Function_base((_Function_base *)&local_ea0);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::~string((string *)&local_c48);
  std::_Function_base::~_Function_base((_Function_base *)&local_e80);
  std::__cxx11::string::~string((string *)&local_c28);
  std::__cxx11::string::~string((string *)&local_c08);
  std::_Function_base::~_Function_base((_Function_base *)&local_e60);
  std::__cxx11::string::~string((string *)&local_be8);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e40);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::__cxx11::string::~string((string *)&local_b88);
  std::_Function_base::~_Function_base((_Function_base *)&local_e20);
  std::__cxx11::string::~string((string *)&local_b68);
  std::__cxx11::string::~string((string *)&local_b48);
  std::_Function_base::~_Function_base((_Function_base *)&local_e00);
  std::__cxx11::string::~string((string *)&local_b28);
  std::__cxx11::string::~string((string *)&local_b08);
  std::_Function_base::~_Function_base((_Function_base *)&local_de0);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::_Function_base::~_Function_base((_Function_base *)&local_dc0);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_a88);
  std::_Function_base::~_Function_base((_Function_base *)&local_da0);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a48);
  std::_Function_base::~_Function_base((_Function_base *)&local_d80);
  std::__cxx11::string::~string((string *)&local_a28);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_7f8);
  lVar1 = 0x48;
  do {
    std::__cxx11::string::~string((string *)(local_a08 + lVar1));
    lVar1 = lVar1 + -0x48;
  } while (lVar1 != -0x48);
  return;
}

Assistant:

FloatType::FloatType() {
	mBinaryOperators = {
		{ '^', Operator::binary('^', 6, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return pow(lhs.floatValue(), rhs.floatValue());
		}) },
		{ '*', Operator::binary('*', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() * rhs.floatValue();
		}) },
		{ '/', Operator::binary('/', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() / rhs.floatValue();
		}) },
		{ '+', Operator::binary('+', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() + rhs.floatValue();
		}) },
		{ '-', Operator::binary('-', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() - rhs.floatValue();
		}) },
		{ '=', Operator::binary('=', 1, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return ResultValue();
		}) }
	};

	mUnaryOperators = {
		{ '-', Operator::unary('-', 7, OperatorAssociativity::LEFT, [&](ResultValue op) {
			return -op.floatValue();
		}) }
	};

	mEnvironment = EnvironmentScope({
										{ "pi", ResultValue(3.141592653589793238463) },
										{ "e", ResultValue(2.718281828459045235360) },
									}, {
										Function("sin", 1, [this](FunctionArguments args) {
											return ResultValue(sin(args.at(0).floatValue()));
										}, "Computes the sine of x."),
										Function("cos", 1, [this](FunctionArguments args) {
											return ResultValue(cos(args.at(0).floatValue()));
										}, "Computes the cosine of x."),
										Function("tan", 1, [this](FunctionArguments args) {
											return ResultValue(tan(args.at(0).floatValue()));
										}, "Computes the tangent of x."),
										Function("sqrt", 1, [this](FunctionArguments args) {
											return ResultValue(sqrt(args.at(0).floatValue()));
										}, "Computes the square root of x."),
										Function("asin", 1, [this](FunctionArguments args) {
											return ResultValue(asin(args.at(0).floatValue()));
										}, "Computes the inverse sine of x."),
										Function("acos", 1, [this](FunctionArguments args) {
											return ResultValue(acos(args.at(0).floatValue()));
										}, "Computes the inverse cosine of x."),
										Function("atan", 1, [this](FunctionArguments args) {
											return ResultValue(atan(args.at(0).floatValue()));
										}, "Computes the inverse tangent of x."),
										Function("ln", 1, [this](FunctionArguments args) {
											return ResultValue(log(args.at(0).floatValue()));
										}, "Computes the natural logarithm of x."),
										Function("log", 1, [this](FunctionArguments args) {
											return ResultValue(log10(args.at(0).floatValue()));
										}, "Computes the 10-logarithm of x."),
										Function("logb", 2, [this](FunctionArguments args) {
											return ResultValue(log(args.at(0).floatValue()) / log(args.at(1).floatValue()));
										}, "Computes the y-logarithm of x."),
										Function("ceil", 1, [this](FunctionArguments x) {
											return ResultValue(ceil(x.at(0).floatValue()));
										}, "Ceils x."),
										Function("floor", 1, [this](FunctionArguments x) {
											return ResultValue(floor(x.at(0).floatValue()));
										}, "Floors x."),
										Function("round", 1, [this](FunctionArguments x) {
											return ResultValue(round(x.at(0).floatValue()));
										}, "Rounds x."),
									});
}